

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::setup_transposeLP(HModel *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  int *piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer piVar11;
  pointer piVar12;
  pointer piVar13;
  pointer piVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  pointer pdVar26;
  int iVar27;
  pointer pdVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  size_type __n;
  long lVar32;
  long lVar33;
  long lVar34;
  size_type sVar35;
  uint uVar36;
  double dVar37;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_139;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_118;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  vector<int,_std::allocator<int>_> local_38;
  
  if ((this->intOption[1] != 0) &&
     (uVar1 = this->numCol, uVar3 = this->numRow, (double)(int)uVar1 / (double)(int)uVar3 <= 0.2)) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_58,(long)(int)uVar1,(allocator_type *)&local_78);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_78,(long)this->numCol,(allocator_type *)&local_98);
    iVar30 = this->numCol;
    if (0 < (long)iVar30) {
      pdVar28 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar33 = 0;
      do {
        dVar37 = pdVar4[lVar33];
        dVar2 = pdVar5[lVar33];
        if ((((dVar37 != -1e+200) || (NAN(dVar37))) || (dVar2 != 1e+200)) || (NAN(dVar2))) {
          if (((dVar37 != 0.0) || (NAN(dVar37))) || ((dVar2 != 1e+200 || (NAN(dVar2))))) {
            if (((dVar37 != -1e+200) || (NAN(dVar37))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
              if ((((dVar37 != 0.0) || (NAN(dVar37))) || (dVar2 != 0.0)) || (NAN(dVar2)))
              goto LAB_0012bee0;
              local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar33] = -1e+200;
            }
            else {
              local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar33] = pdVar28[lVar33];
            }
            dVar37 = 1e+200;
          }
          else {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar33] = -1e+200;
            dVar37 = pdVar28[lVar33];
          }
        }
        else {
          dVar37 = pdVar28[lVar33];
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = dVar37;
        }
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar33] = dVar37;
        lVar33 = lVar33 + 1;
      } while (iVar30 != lVar33);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_98,(long)this->numRow,(allocator_type *)&local_b8);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_b8,(long)this->numRow,(allocator_type *)&local_d8);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,(long)this->numRow,(allocator_type *)&local_38);
    __n = (size_type)this->numRow;
    if (0 < (long)__n) {
      pdVar28 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar35 = 0;
      do {
        dVar37 = pdVar28[sVar35];
        dVar2 = pdVar4[sVar35];
        if ((dVar37 != dVar2) || (NAN(dVar37) || NAN(dVar2))) {
          if (((dVar37 != -1e+200) || (NAN(dVar37))) || ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
            if (((dVar37 != -1e+200) || (NAN(dVar37))) && ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar35] = 0.0;
              goto LAB_0012ba8d;
            }
            if ((dVar37 != -1e+200) || (((NAN(dVar37) || (dVar2 != 1e+200)) || (NAN(dVar2)))))
            goto LAB_0012bead;
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[sVar35] = 0.0;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[sVar35] = 0.0;
            dVar37 = 0.0;
          }
          else {
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[sVar35] = -1e+200;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[sVar35] = 0.0;
            dVar37 = -dVar2;
          }
        }
        else {
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[sVar35] = -1e+200;
LAB_0012ba8d:
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[sVar35] = 1e+200;
          dVar37 = -dVar37;
        }
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[sVar35] = dVar37;
        sVar35 = sVar35 + 1;
      } while (__n != sVar35);
    }
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_38,__n,(value_type *)&local_118,(allocator_type *)&local_138);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_118,(long)this->numRow + 1,(value_type *)&local_138,
               (allocator_type *)&local_f8);
    uVar36 = (uint)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_138,(long)(int)uVar36,(allocator_type *)&local_f8);
    std::vector<double,_std::allocator<double>_>::vector(&local_f8,(long)(int)uVar36,&local_139);
    if (0 < (int)uVar36) {
      piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar29 = 0;
      do {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[piVar6[uVar29]] =
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar6[uVar29]] + 1;
        uVar29 = uVar29 + 1;
      } while ((uVar36 & 0x7fffffff) != uVar29);
    }
    iVar30 = this->numRow;
    if (0 < iVar30) {
      iVar31 = *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar33 = 0;
      do {
        iVar31 = iVar31 + local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar33];
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar33 + 1] = iVar31;
        iVar30 = this->numRow;
        lVar33 = lVar33 + 1;
      } while (lVar33 < iVar30);
      if (0 < iVar30) {
        lVar33 = 0;
        do {
          local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar33] =
               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar33];
          lVar33 = lVar33 + 1;
          iVar30 = this->numRow;
        } while (lVar33 < iVar30);
      }
    }
    iVar31 = this->numCol;
    piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar31 < 1) {
      pdVar28 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar28 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar30 = *piVar7;
      lVar33 = 0;
      do {
        lVar34 = lVar33 + 1;
        iVar27 = piVar7[lVar33 + 1];
        if (iVar30 < piVar7[lVar33 + 1]) {
          lVar32 = (long)iVar30;
          do {
            iVar30 = piVar6[lVar32];
            iVar31 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar30];
            local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar30] = iVar31 + 1;
            local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar31] = (int)lVar33;
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar31] = pdVar28[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 < piVar7[lVar34]);
          iVar31 = this->numCol;
          iVar27 = piVar7[lVar34];
        }
        iVar30 = iVar27;
        lVar33 = lVar34;
      } while (lVar34 < iVar31);
      iVar30 = this->numRow;
    }
    this->numRow = iVar31;
    this->numCol = iVar30;
    piVar11 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar12 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    piVar13 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar14 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pdVar16 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar17 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar19 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar20 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar8 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar21 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar22 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar9 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar23 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar10 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pdVar25 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar26 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar13;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar14;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar6;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar7;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar11;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar12;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar28;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar15;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar16;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar25;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar26;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar10;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar19;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar20;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar5;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar17;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar18;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar4;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar23;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar24;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar9;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar21;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar22;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar8;
    mlFg_Update(this,this->mlFg_action_TransposeLP);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_0012bead:
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_0012bee0:
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HModel::setup_transposeLP() {
    if (intOption[INTOPT_TRANSPOSE_FLAG] == 0)
        return;

    int transposeCancelled = 0;
    if (1.0 * numCol / numRow > 0.2) {
//        cout << "transpose-cancelled-by-ratio" << endl;
        transposeCancelled = 1;
        return;
    }

    // Convert primal cost to dual bound
    const double inf = HSOL_CONST_INF;
    vector<double> dualRowLower(numCol);
    vector<double> dualRowUpper(numCol);
    for (int j = 0; j < numCol; j++) {
        double lower = colLower[j];
        double upper = colUpper[j];

        /*
         * Primal      Dual
         * Free        row = c
         * x > 0       row < c
         * x < 0       row > c
         * x = 0       row free
         * other       cancel
         */

        if (lower == -inf && upper == inf) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = colCost[j];
        } else if (lower == 0 && upper == inf) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = colCost[j];
        } else if (lower == -inf && upper == 0) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = +inf;
        } else if (lower == 0 && upper == 0) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = +inf;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-column" << endl;
        return;
    }

    // Convert primal row bound to dual variable cost
    vector<double> dualColLower(numRow);
    vector<double> dualColUpper(numRow);
    vector<double> dualCost(numRow);
    for (int i = 0; i < numRow; i++) {
        double lower = rowLower[i];
        double upper = rowUpper[i];

        /*
         * Primal      Dual
         * row = b     Free
         * row < b     y < 0
         * row > b     y > 0
         * row free    y = 0
         * other       cancel
         */

        if (lower == upper) {
            dualColLower[i] = -inf;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper != inf) {
            dualColLower[i] = -inf;
            dualColUpper[i] = 0;
            dualCost[i] = -upper;
        } else if (lower != -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = 0;
            dualCost[i] = 0;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-row" << endl;
        return;
    }

    // We can now really transpose things
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Transpose the problem!
    swap(numRow, numCol);
    Astart.swap(ARstart);
    Aindex.swap(ARindex);
    Avalue.swap(ARvalue);
    colLower.swap(dualColLower);
    colUpper.swap(dualColUpper);
    rowLower.swap(dualRowLower);
    rowUpper.swap(dualRowUpper);
    colCost.swap(dualCost);
//    cout << "problem-transposed" << endl;
    //Deduce the consequences of transposing the LP
    mlFg_Update(mlFg_action_TransposeLP);
}